

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthUniqueNew(uint *pRes,uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  uint *puVar9;
  ulong uVar10;
  
  uVar5 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar5 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x39f,"void Kit_TruthUniqueNew(unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar5) {
      uVar3 = 0;
      do {
        uVar7 = pTruth[uVar3];
        pRes[uVar3] = (uVar7 >> 1 & 0x55555555) + (uVar7 & 0xd5555555) * 2 ^ uVar7;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    break;
  case 1:
    if (0 < (int)uVar5) {
      uVar3 = 0;
      do {
        uVar7 = pTruth[uVar3];
        pRes[uVar3] = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0xf3333333) * 4 ^ uVar7;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    break;
  case 2:
    if (0 < (int)uVar5) {
      uVar3 = 0;
      do {
        uVar7 = pTruth[uVar3];
        pRes[uVar3] = ((uVar7 & 0xf0f0f0f) << 4 | uVar7 >> 4 & 0xf0f0f0f) ^ uVar7;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    break;
  case 3:
    if (0 < (int)uVar5) {
      uVar3 = 0;
      do {
        uVar7 = pTruth[uVar3];
        pRes[uVar3] = (((uVar7 & 0xff00) << 8 | uVar7 << 0x18) >> 0x10 |
                      (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8) << 0x10) ^ uVar7;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    break;
  case 4:
    if (0 < (int)uVar5) {
      uVar3 = 0;
      do {
        uVar7 = pTruth[uVar3];
        pRes[uVar3] = (uVar7 << 0x10 | uVar7 >> 0x10) ^ uVar7;
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
    }
    break;
  default:
    if (0 < (int)uVar5) {
      bVar2 = (byte)(iVar + -5);
      uVar7 = 1 << (bVar2 & 0x1f);
      iVar6 = 2 << (bVar2 & 0x1f);
      uVar3 = 1;
      if (1 < (int)uVar7) {
        uVar3 = (ulong)uVar7;
      }
      puVar8 = pTruth + (int)uVar7;
      puVar9 = pRes + (int)uVar7;
      iVar4 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar10 = 0;
          do {
            uVar7 = puVar8[uVar10];
            uVar1 = pTruth[uVar10];
            pRes[uVar10] = uVar7 ^ uVar1;
            puVar9[uVar10] = uVar7 ^ uVar1;
            uVar10 = uVar10 + 1;
          } while (uVar3 != uVar10);
        }
        iVar4 = iVar4 + iVar6;
        puVar8 = puVar8 + iVar6;
        puVar9 = puVar9 + iVar6;
        pRes = pRes + iVar6;
        pTruth = pTruth + iVar6;
      } while (iVar4 < (int)uVar5);
    }
  }
  return;
}

Assistant:

void Kit_TruthUniqueNew( unsigned * pRes, unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] ^ (((pTruth[i] & 0xAAAAAAAA) >> 1) | ((pTruth[i] & 0x55555555) << 1));
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] ^ (((pTruth[i] & 0xCCCCCCCC) >> 2) | ((pTruth[i] & 0x33333333) << 2));
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] ^ (((pTruth[i] & 0xF0F0F0F0) >> 4) | ((pTruth[i] & 0x0F0F0F0F) << 4));
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] ^ (((pTruth[i] & 0xFF00FF00) >> 8) | ((pTruth[i] & 0x00FF00FF) << 8));
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] ^ (((pTruth[i] & 0xFFFF0000) >> 16) | ((pTruth[i] & 0x0000FFFF) << 16));
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pRes[i]      = pTruth[i] ^ pTruth[Step+i];
                pRes[Step+i] = pRes[i];
            }
            pRes += 2*Step;
            pTruth += 2*Step;
        }
        return;
    }
}